

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CriticalSectionsBuilder.cpp
# Opt level: O2

void __thiscall CriticalSectionsBuilder::~CriticalSectionsBuilder(CriticalSectionsBuilder *this)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  
  for (p_Var2 = (this->criticalSections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->criticalSections_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    p_Var1 = p_Var2[1]._M_parent;
    if (p_Var1 != (_Base_ptr)0x0) {
      std::
      _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>::
      ~_Rb_tree((_Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
                 *)&p_Var1->_M_parent);
    }
    operator_delete(p_Var1,0x38);
  }
  std::
  _Rb_tree<const_llvm::CallInst_*,_std::pair<const_llvm::CallInst_*const,_CriticalSection_*>,_std::_Select1st<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>,_std::less<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>_>
  ::~_Rb_tree(&(this->criticalSections_)._M_t);
  std::_Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
  ::~_Rb_tree(&(this->examined_)._M_t);
  std::_Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
  ::~_Rb_tree(&(this->visited_)._M_t);
  std::
  _Rb_tree<UnlockNode_*,_UnlockNode_*,_std::_Identity<UnlockNode_*>,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_>
  ::~_Rb_tree(&(this->currentUnlocks)._M_t);
  std::
  _Rb_tree<LockNode_*,_LockNode_*,_std::_Identity<LockNode_*>,_std::less<LockNode_*>,_std::allocator<LockNode_*>_>
  ::~_Rb_tree((_Rb_tree<LockNode_*,_LockNode_*,_std::_Identity<LockNode_*>,_std::less<LockNode_*>,_std::allocator<LockNode_*>_>
               *)this);
  return;
}

Assistant:

CriticalSectionsBuilder::~CriticalSectionsBuilder() {
    for (auto iterator : criticalSections_) {
        delete iterator.second;
    }
}